

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

int32_t __thiscall icu_63::Calendar::getRelatedYear(Calendar *this,UErrorCode *status)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  char **ppcVar3;
  int iVar4;
  int i;
  long lVar5;
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  complete(this,status);
  iVar4 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar4 = this->fFields[0x13];
    iVar1 = (*(this->super_UObject)._vptr_UObject[0x17])(this);
    ppcVar3 = gCalTypes;
    lVar5 = 0;
    do {
      iVar2 = uprv_stricmp_63((char *)CONCAT44(extraout_var,iVar1),*ppcVar3);
      if (iVar2 == 0) {
        switch((int)lVar5) {
        case 4:
          iVar4 = iVar4 + 0x26e;
          break;
        case 5:
        case 6:
        case 0xf:
        case 0x10:
        case 0x11:
          if (iVar4 < 0x575) {
            iVar1 = (((uint)((ulong)(0x574U - iVar4) * 0x7a44c6b >> 0x20) & 0xfffffffe) -
                    (uint)((0x574U - iVar4) % 0x43 < 0x22)) + 2;
          }
          else {
            iVar1 = (((iVar4 - 0x575U) % 0x43 < 0x21) - 1) -
                    ((uint)((ulong)(iVar4 - 0x575U) * 0x7a44c6b >> 0x20) & 0xfffffffe);
          }
          return iVar1 + iVar4 + 0x243;
        case 7:
          iVar4 = iVar4 + -0xeb0;
          break;
        case 8:
          iVar4 = iVar4 + -0xa4d;
          break;
        case 9:
          iVar4 = iVar4 + 0x4f;
          break;
        case 10:
          iVar4 = iVar4 + 0x11c;
          break;
        case 0xb:
          iVar4 = iVar4 + 8;
          break;
        case 0xc:
          iVar4 = iVar4 + -0x1574;
          break;
        case 0xe:
          iVar4 = iVar4 + -0x91d;
        }
        break;
      }
      lVar5 = lVar5 + 1;
      ppcVar3 = ppcVar3 + 1;
    } while (lVar5 != 0x12);
  }
  return iVar4;
}

Assistant:

int32_t Calendar::getRelatedYear(UErrorCode &status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
    int32_t year = get(UCAL_EXTENDED_YEAR, status);
    if (U_FAILURE(status)) {
        return 0;
    }
    // modify for calendar type
    ECalType type = getCalendarType(getType());
    switch (type) {
        case CALTYPE_PERSIAN:
            year += 622; break;
        case CALTYPE_HEBREW:
            year -= 3760; break;
        case CALTYPE_CHINESE:
            year -= 2637; break;
        case CALTYPE_INDIAN:
            year += 79; break;
        case CALTYPE_COPTIC:
            year += 284; break;
        case CALTYPE_ETHIOPIC:
            year += 8; break;
        case CALTYPE_ETHIOPIC_AMETE_ALEM:
            year -=5492; break;
        case CALTYPE_DANGI:
            year -= 2333; break;
        case CALTYPE_ISLAMIC_CIVIL:
        case CALTYPE_ISLAMIC:
        case CALTYPE_ISLAMIC_UMALQURA:
        case CALTYPE_ISLAMIC_TBLA:
        case CALTYPE_ISLAMIC_RGSA:
            year = gregoYearFromIslamicStart(year); break;
        default:
            // CALTYPE_GREGORIAN
            // CALTYPE_JAPANESE
            // CALTYPE_BUDDHIST
            // CALTYPE_ROC
            // CALTYPE_ISO8601
            // do nothing, EXTENDED_YEAR same as Gregorian
            break;
    }
    return year;
}